

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quadrule.cpp
# Opt level: O3

double class_matrix(int kind,int m,double alpha,double beta,double *aj,double *bj)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  long lVar5;
  int iVar6;
  ulong uVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  
  dVar1 = r8_epsilon();
  parchk(kind,m * 2 + -1,alpha,beta);
  dVar8 = r8_gamma(0.5);
  dVar8 = r8_abs(dVar8 * dVar8 + -3.141592653589793);
  if (dVar8 <= dVar1 * 500.0) {
    switch(kind) {
    case 1:
      dVar1 = 2.0;
      if (0 < m) {
        memset(aj,0,(ulong)(uint)m << 3);
        uVar7 = 1;
        iVar6 = 2;
        do {
          dVar1 = ((double)(int)uVar7 * (double)(int)uVar7) / ((double)iVar6 * (double)iVar6 + -1.0)
          ;
          if (dVar1 < 0.0) {
            dVar1 = sqrt(dVar1);
          }
          else {
            dVar1 = SQRT(dVar1);
          }
          bj[uVar7 - 1] = dVar1;
          uVar7 = uVar7 + 1;
          iVar6 = iVar6 + 2;
        } while (m + 1 != uVar7);
        dVar1 = 2.0;
      }
      break;
    case 2:
      if (m < 1) {
        *bj = 0.7071067811865476;
        dVar1 = 3.141592653589793;
      }
      else {
        memset(aj,0,(ulong)(uint)m * 8);
        *bj = 0.7071067811865476;
        dVar1 = 3.141592653589793;
        if (m != 1) {
          uVar7 = 1;
          do {
            bj[uVar7] = 0.5;
            uVar7 = uVar7 + 1;
            dVar1 = 3.141592653589793;
          } while ((uint)m != uVar7);
        }
      }
      break;
    case 3:
      dVar8 = alpha + alpha;
      dVar2 = exp2(dVar8 + 1.0);
      dVar3 = r8_gamma(alpha + 1.0);
      dVar1 = r8_gamma(dVar8 + 2.0);
      if (0 < m) {
        memset(aj,0,(ulong)(uint)m << 3);
      }
      dVar4 = 1.0 / (dVar8 + 3.0);
      if (dVar4 < 0.0) {
        dVar4 = sqrt(dVar4);
      }
      else {
        dVar4 = SQRT(dVar4);
      }
      dVar1 = (dVar2 * dVar3 * dVar3) / dVar1;
      *bj = dVar4;
      if (1 < m) {
        uVar7 = 2;
        do {
          dVar2 = (double)(int)uVar7;
          dVar2 = ((dVar8 + dVar2) * dVar2) / ((dVar2 + alpha) * (dVar2 + alpha) * 4.0 + -1.0);
          if (dVar2 < 0.0) {
            dVar2 = sqrt(dVar2);
          }
          else {
            dVar2 = SQRT(dVar2);
          }
          bj[uVar7 - 1] = dVar2;
          uVar7 = uVar7 + 1;
        } while (m + 1 != uVar7);
      }
      break;
    case 4:
      dVar8 = alpha + beta;
      dVar9 = dVar8 + 2.0;
      dVar2 = exp2(dVar8 + 1.0);
      dVar3 = r8_gamma(alpha + 1.0);
      dVar4 = r8_gamma(beta + 1.0);
      dVar1 = r8_gamma(dVar9);
      *aj = (beta - alpha) / dVar9;
      dVar9 = ((alpha + 1.0) * 4.0 * (beta + 1.0)) / ((dVar9 + 1.0) * dVar9 * dVar9);
      if (dVar9 < 0.0) {
        dVar9 = sqrt(dVar9);
      }
      else {
        dVar9 = SQRT(dVar9);
      }
      dVar1 = (dVar4 * dVar3 * dVar2) / dVar1;
      *bj = dVar9;
      if (1 < m) {
        uVar7 = 2;
        do {
          dVar2 = (double)(int)uVar7;
          dVar3 = dVar2 + dVar2 + dVar8;
          aj[uVar7 - 1] = (beta * beta - alpha * alpha) / ((dVar3 + -2.0) * dVar3);
          dVar2 = ((dVar2 + beta) * (dVar2 + alpha) * dVar2 * 4.0 * (dVar8 + dVar2)) /
                  ((dVar3 * dVar3 + -1.0) * dVar3 * dVar3);
          if (dVar2 < 0.0) {
            dVar2 = sqrt(dVar2);
          }
          else {
            dVar2 = SQRT(dVar2);
          }
          bj[uVar7 - 1] = dVar2;
          uVar7 = uVar7 + 1;
        } while (m + 1 != uVar7);
      }
      break;
    case 5:
      dVar1 = r8_gamma(alpha + 1.0);
      if (0 < m) {
        uVar7 = 1;
        do {
          dVar2 = (double)(int)uVar7;
          dVar8 = (dVar2 + alpha) * dVar2;
          aj[uVar7 - 1] = dVar2 + dVar2 + -1.0 + alpha;
          if (dVar8 < 0.0) {
            dVar8 = sqrt(dVar8);
          }
          else {
            dVar8 = SQRT(dVar8);
          }
          bj[uVar7 - 1] = dVar8;
          uVar7 = uVar7 + 1;
        } while (m + 1 != uVar7);
      }
      break;
    case 6:
      dVar1 = r8_gamma((alpha + 1.0) * 0.5);
      if (0 < m) {
        memset(aj,0,(ulong)(uint)m << 3);
        uVar7 = 1;
        do {
          dVar8 = ((double)((uint)uVar7 & 1) * alpha + (double)(int)(uint)uVar7) * 0.5;
          if (dVar8 < 0.0) {
            dVar8 = sqrt(dVar8);
          }
          else {
            dVar8 = SQRT(dVar8);
          }
          bj[uVar7 - 1] = dVar8;
          uVar7 = uVar7 + 1;
        } while (m + 1 != uVar7);
      }
      break;
    case 7:
      dVar1 = 2.0 / (alpha + 1.0);
      if (0 < m) {
        memset(aj,0,(ulong)(uint)m << 3);
        uVar7 = 1;
        iVar6 = 2;
        do {
          dVar8 = (double)((uint)uVar7 & 1) * alpha + (double)(int)(uint)uVar7;
          dVar8 = (dVar8 * dVar8) / (((double)iVar6 + alpha) * ((double)iVar6 + alpha) + -1.0);
          if (dVar8 < 0.0) {
            dVar8 = sqrt(dVar8);
          }
          else {
            dVar8 = SQRT(dVar8);
          }
          bj[uVar7 - 1] = dVar8;
          uVar7 = uVar7 + 1;
          iVar6 = iVar6 + 2;
        } while (m + 1 != uVar7);
      }
      break;
    case 8:
      dVar4 = alpha + beta;
      dVar8 = alpha + 1.0;
      dVar2 = r8_gamma(dVar8);
      dVar3 = r8_gamma(-(dVar4 + 1.0));
      dVar1 = r8_gamma(-beta);
      dVar9 = -dVar8 / (dVar4 + 2.0);
      *aj = dVar9;
      *bj = (((beta + 1.0) * -dVar9) / (dVar4 + 2.0)) / (dVar4 + 3.0);
      if (1 < m) {
        lVar5 = 1;
        do {
          iVar6 = (int)(lVar5 + 1);
          dVar9 = (double)iVar6;
          dVar10 = dVar9 + dVar9 + dVar4;
          aj[lVar5] = (-((double)(iVar6 + -1) * (dVar4 + dVar9 + dVar4 + dVar9) + dVar8 * dVar4) /
                      dVar10) / (dVar10 + -2.0);
          uVar7 = lVar5 + 2;
          lVar5 = lVar5 + 1;
        } while (uVar7 != m + 1);
        if (m != 2) {
          uVar7 = 2;
          do {
            dVar8 = (double)(int)uVar7;
            dVar9 = dVar8 + dVar8 + dVar4;
            bj[uVar7 - 1] =
                 ((((dVar8 + beta) * (((dVar8 + alpha) * dVar8) / (dVar9 + -1.0))) / (dVar9 * dVar9)
                  ) * (dVar4 + dVar8)) / (dVar9 + 1.0);
            uVar7 = uVar7 + 1;
          } while ((uint)m != uVar7);
        }
      }
      dVar1 = (dVar3 * dVar2) / dVar1;
      bj[(long)m + -1] = 0.0;
      if (0 < m) {
        uVar7 = 0;
        do {
          dVar8 = bj[uVar7];
          if (dVar8 < 0.0) {
            dVar8 = sqrt(dVar8);
          }
          else {
            dVar8 = SQRT(dVar8);
          }
          bj[uVar7] = dVar8;
          uVar7 = uVar7 + 1;
        } while ((uint)m != uVar7);
      }
      break;
    case 9:
      dVar1 = 1.5707963267948966;
      if (0 < m) {
        uVar7 = 0;
        memset(aj,0,(ulong)(uint)m * 8);
        do {
          bj[uVar7] = 0.5;
          uVar7 = uVar7 + 1;
        } while ((uint)m != uVar7);
        dVar1 = 1.5707963267948966;
      }
      break;
    default:
      dVar1 = 0.0;
    }
    return dVar1;
  }
  std::operator<<((ostream *)&std::cerr,"\n");
  std::operator<<((ostream *)&std::cerr,"CLASS_MATRIX - Fatal error!\n");
  std::operator<<((ostream *)&std::cerr,"  Gamma function does not match machine parameters.\n");
  exit(1);
}

Assistant:

double class_matrix ( int kind, int m, double alpha, double beta, double aj[], 
  double bj[] )

//****************************************************************************80
//
//  Purpose:
//
//    CLASS_MATRIX computes the Jacobi matrix for a quadrature rule.
//
//  Discussion:
//
//    This routine computes the diagonal AJ and sub-diagonal BJ
//    elements of the order M tridiagonal symmetric Jacobi matrix
//    associated with the polynomials orthogonal with respect to
//    the weight function specified by KIND.
//
//    For weight functions 1-7, M elements are defined in BJ even
//    though only M-1 are needed.  For weight function 8, BJ(M) is
//    set to zero.
//
//    The zero-th moment of the weight function is returned in ZEMU.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license. 
//
//  Modified:
//
//    16 February 2010
//
//  Author:
//
//    Original FORTRAN77 version by Sylvan Elhay, Jaroslav Kautsky.
//    C++ version by John Burkardt.
//
//  Reference:
//
//    Sylvan Elhay, Jaroslav Kautsky,
//    Algorithm 655: IQPACK, FORTRAN Subroutines for the Weights of 
//    Interpolatory Quadrature,
//    ACM Transactions on Mathematical Software,
//    Volume 13, Number 4, December 1987, pages 399-415.
//
//  Parameters:
//
//    Input, int KIND, the rule.
//    1, Legendre,             (a,b)       1.0
//    2, Chebyshev Type 1,     (a,b)       ((b-x)*(x-a))^(-0.5)
//    3, Gegenbauer,           (a,b)       ((b-x)*(x-a))^alpha
//    4, Jacobi,               (a,b)       (b-x)^alpha*(x-a)^beta
//    5, Generalized Laguerre, (a,+oo)     (x-a)^alpha*exp(-b*(x-a))
//    6, Generalized Hermite,  (-oo,+oo)   |x-a|^alpha*exp(-b*(x-a)^2)
//    7, Exponential,          (a,b)       |x-(a+b)/2.0|^alpha
//    8, Rational,             (a,+oo)     (x-a)^alpha*(x+b)^beta
//    9, Chebyshev Type 2,     (a,b)       ((b-x)*(x-a))^(+0.5)
//
//    Input, int M, the order of the Jacobi matrix.
//
//    Input, double ALPHA, the value of Alpha, if needed.
//
//    Input, double BETA, the value of Beta, if needed.
//
//    Output, double AJ[M], BJ[M], the diagonal and subdiagonal
//    of the Jacobi matrix.
//
//    Output, double CLASS_MATRIX, the zero-th moment.
//
{
  double a2b2;
  double ab;
  double aba;
  double abi;
  double abj;
  double abti;
  double apone;
  int i;
  double pi = 3.14159265358979323846264338327950;
  double temp;
  double temp2;
  double zemu = 0.0; // Uninitialized warning.

  temp = r8_epsilon ( );

  parchk ( kind, 2 * m - 1, alpha, beta );

  temp2 = 0.5;

  if ( 500.0 * temp < r8_abs ( pow ( r8_gamma ( temp2 ), 2 ) - pi ) )
  {
    std::cerr << "\n";
    std::cerr << "CLASS_MATRIX - Fatal error!\n";
    std::cerr << "  Gamma function does not match machine parameters.\n";
    exit ( 1 );
  }

  if ( kind == 1 )
  {
    ab = 0.0;

    zemu = 2.0 / ( ab + 1.0 );

    for ( i = 0; i < m; i++ )
    {
      aj[i] = 0.0;
    }

    for ( i = 1; i <= m; i++ )
    {
      abi = i + ab * ( i % 2 );
      abj = 2 * i + ab;
      bj[i-1] = sqrt ( abi * abi / ( abj * abj - 1.0 ) );
    }
  }
  else if ( kind == 2 )
  {
    zemu = pi;

    for ( i = 0; i < m; i++ )
    {
      aj[i] = 0.0;
    }

    bj[0] = sqrt ( 0.5 );
    for ( i = 1; i < m; i++ )
    {
      bj[i] = 0.5;
    }
  }
  else if ( kind == 3 )
  {
    ab = alpha * 2.0;
    zemu = pow ( 2.0, ab + 1.0 ) * pow ( r8_gamma ( alpha + 1.0 ), 2 )
      / r8_gamma ( ab + 2.0 );

    for ( i = 0; i < m; i++ )
    {
      aj[i] = 0.0;
    }

    bj[0] = sqrt ( 1.0 / ( 2.0 * alpha + 3.0 ) );
    for ( i = 2; i <= m; i++ )
    {
      bj[i-1] = sqrt ( i * ( i + ab ) / ( 4.0 * pow ( i + alpha, 2 ) - 1.0 ) );
    }
  }
  else if ( kind == 4 )
  {
    ab = alpha + beta;
    abi = 2.0 + ab;
    zemu = pow ( 2.0, ab + 1.0 ) * r8_gamma ( alpha + 1.0 ) 
      * r8_gamma ( beta + 1.0 ) / r8_gamma ( abi );
    aj[0] = ( beta - alpha ) / abi;
    bj[0] = sqrt ( 4.0 * ( 1.0 + alpha ) * ( 1.0 + beta ) 
      / ( ( abi + 1.0 ) * abi * abi ) );
    a2b2 = beta * beta - alpha * alpha;

    for ( i = 2; i <= m; i++ )
    {
      abi = 2.0 * i + ab;
      aj[i-1] = a2b2 / ( ( abi - 2.0 ) * abi );
      abi = abi * abi;
      bj[i-1] = sqrt ( 4.0 * i * ( i + alpha ) * ( i + beta ) * ( i + ab ) 
        / ( ( abi - 1.0 ) * abi ) );
    }
  }
  else if ( kind == 5 )
  {
    zemu = r8_gamma ( alpha + 1.0 );

    for ( i = 1; i <= m; i++ )
    {
      aj[i-1] = 2.0 * i - 1.0 + alpha;
      bj[i-1] = sqrt ( i * ( i + alpha ) );
    }
  }
  else if ( kind == 6 )
  {
    zemu = r8_gamma ( ( alpha + 1.0 ) / 2.0 );

    for ( i = 0; i < m; i++ )
    {
      aj[i] = 0.0;
    }

    for ( i = 1; i <= m; i++ )
    {
      bj[i-1] = sqrt ( ( i + alpha * ( i % 2 ) ) / 2.0 );
    }
  }
  else if ( kind == 7 )
  {
    ab = alpha;
    zemu = 2.0 / ( ab + 1.0 );

    for ( i = 0; i < m; i++ )
    {
      aj[i] = 0.0;
    }

    for ( i = 1; i <= m; i++ )
    {
      abi = i + ab * ( i % 2 );
      abj = 2 * i + ab;
      bj[i-1] = sqrt ( abi * abi / ( abj * abj - 1.0 ) );
    }
  }
  else if ( kind == 8 )
  {
    ab = alpha + beta;
    zemu = r8_gamma ( alpha + 1.0 ) * r8_gamma ( - ( ab + 1.0 ) ) 
      / r8_gamma ( - beta );
    apone = alpha + 1.0;
    aba = ab * apone;
    aj[0] = - apone / ( ab + 2.0 );
    bj[0] = - aj[0] * ( beta + 1.0 ) / ( ab + 2.0 ) / ( ab + 3.0 );
    for ( i = 2; i <= m; i++ )
    {
      abti = ab + 2.0 * i;
      aj[i-1] = aba + 2.0 * ( ab + i ) * ( i - 1 );
      aj[i-1] = - aj[i-1] / abti / ( abti - 2.0 );
    }

    for ( i = 2; i <= m - 1; i++ )
    {
      abti = ab + 2.0 * i;
      bj[i-1] = i * ( alpha + i ) / ( abti - 1.0 ) * ( beta + i ) 
        / ( abti * abti ) * ( ab + i ) / ( abti + 1.0 );
    }
    bj[m-1] = 0.0;
    for ( i = 0; i < m; i++ )
    {
      bj[i] = sqrt ( bj[i] );
    }
  }
  else if ( kind == 9 )
  {
    zemu = pi / 2.0;

    for ( i = 0; i < m; i++ )
    {
      aj[i] = 0.0;
    }

    for ( i = 0; i < m; i++ )
    {
      bj[i] = 0.5;
    }
  }

  return zemu;
}